

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O3

void mp::WriteVar<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *pr,char *name,double lb,double ub,
               Type ty)

{
  char *pcVar1;
  size_t __n;
  size_t sVar2;
  Buffer<char> *pBVar3;
  ulong uVar4;
  ptrdiff_t _Num;
  char *str;
  FormatSpec local_48;
  
  pBVar3 = (pr->super_BasicWriter<char>).buffer_;
  sVar2 = pBVar3->size_;
  uVar4 = sVar2 + 4;
  if (pBVar3->capacity_ < uVar4) {
    (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
    sVar2 = pBVar3->size_;
  }
  builtin_strncpy(pBVar3->ptr_ + sVar2,"var ",4);
  pBVar3->size_ = uVar4;
  __n = strlen(name);
  pBVar3 = (pr->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar3->size_ + __n;
  if (pBVar3->capacity_ < uVar4) {
    (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar3->ptr_ + pBVar3->size_,name,__n);
  }
  pBVar3->size_ = uVar4;
  if (ty == INTEGER && (lb == 0.0 && ub == 1.0)) {
    pBVar3 = (pr->super_BasicWriter<char>).buffer_;
    sVar2 = pBVar3->size_;
    uVar4 = sVar2 + 7;
    if (pBVar3->capacity_ < uVar4) {
      (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
      sVar2 = pBVar3->size_;
    }
    builtin_strncpy(pBVar3->ptr_ + sVar2," binary",7);
  }
  else {
    if ((lb == ub) && (!NAN(lb) && !NAN(ub))) {
      pBVar3 = (pr->super_BasicWriter<char>).buffer_;
      sVar2 = pBVar3->size_;
      uVar4 = sVar2 + 3;
      if (pBVar3->capacity_ < uVar4) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
        sVar2 = pBVar3->size_;
      }
      pcVar1 = pBVar3->ptr_;
      pcVar1[sVar2 + 2] = ' ';
      pcVar1 = pcVar1 + sVar2;
      pcVar1[0] = ' ';
      pcVar1[1] = '=';
      pBVar3->size_ = uVar4;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&pr->super_BasicWriter<char>,lb,&local_48);
      return;
    }
    if (-1.79769313486232e+308 < lb) {
      pBVar3 = (pr->super_BasicWriter<char>).buffer_;
      sVar2 = pBVar3->size_;
      uVar4 = sVar2 + 3;
      if (pBVar3->capacity_ < uVar4) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
        sVar2 = pBVar3->size_;
      }
      pcVar1 = pBVar3->ptr_;
      pcVar1[sVar2 + 2] = '=';
      pcVar1 = pcVar1 + sVar2;
      pcVar1[0] = ' ';
      pcVar1[1] = '>';
      pBVar3->size_ = uVar4;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&pr->super_BasicWriter<char>,lb,&local_48);
    }
    if (ub < 1.79769313486232e+308) {
      pBVar3 = (pr->super_BasicWriter<char>).buffer_;
      sVar2 = pBVar3->size_;
      uVar4 = sVar2 + 3;
      if (pBVar3->capacity_ < uVar4) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
        sVar2 = pBVar3->size_;
      }
      pcVar1 = pBVar3->ptr_;
      pcVar1[sVar2 + 2] = '=';
      pcVar1 = pcVar1 + sVar2;
      pcVar1[0] = ' ';
      pcVar1[1] = '<';
      pBVar3->size_ = uVar4;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&pr->super_BasicWriter<char>,ub,&local_48);
    }
    if (ty != INTEGER) {
      return;
    }
    pBVar3 = (pr->super_BasicWriter<char>).buffer_;
    sVar2 = pBVar3->size_;
    uVar4 = sVar2 + 8;
    if (pBVar3->capacity_ < uVar4) {
      (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
      sVar2 = pBVar3->size_;
    }
    builtin_strncpy(pBVar3->ptr_ + sVar2," integer",8);
  }
  pBVar3->size_ = uVar4;
  return;
}

Assistant:

void WriteVar(Writer& pr, const char* name,
              double lb, double ub, var::Type ty) {
  assert(*name);
  pr << "var " << name;
  if (!lb && 1.0==ub && var::INTEGER==ty)
    pr << " binary";
  else if (lb==ub)
    pr << " = " << lb;
  else {
    if (lb > -DBL_MAX)
    pr << " >=" << lb;
    if (ub < DBL_MAX)
    pr << " <=" << ub;
    if (var::INTEGER == ty)
    pr << " integer";
  }
}